

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

value * mjs::json_parse(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                       vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  wstring_view name;
  bool bVar1;
  value_type vVar2;
  gc_heap *h;
  const_reference pvVar3;
  size_type sVar4;
  gc_heap_ptr_untyped *this;
  object *poVar5;
  global_object *pgVar6;
  size_t in_stack_fffffffffffffe38;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_138;
  string local_128;
  undefined1 local_118 [8];
  object_ptr holder;
  value val;
  bool local_c9;
  string local_c8;
  wstring_view local_b8;
  wstring local_a8;
  undefined1 local_88 [8];
  json_lexer lex;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  lex.tok_.pos_ = (size_t)args;
  local_c9 = std::vector<mjs::value,_std::allocator<mjs::value>_>::empty(args);
  if (local_c9) {
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_b8,L"undefined");
  }
  else {
    h = gc_heap_ptr_untyped::heap(&global->super_gc_heap_ptr_untyped);
    pvVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::front
                       ((vector<mjs::value,_std::allocator<mjs::value>_> *)lex.tok_.pos_);
    to_string((mjs *)&local_c8,h,pvVar3);
    local_b8 = string::view(&local_c8);
  }
  local_c9 = !local_c9;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&local_a8,&local_b8,
             (allocator<wchar_t> *)
             ((long)&val.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                     super_gc_heap_ptr_untyped.pos_ + 3));
  anon_unknown_46::json_lexer::json_lexer((json_lexer *)local_88,global,&local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  std::allocator<wchar_t>::~allocator
            ((allocator<wchar_t> *)
             ((long)&val.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                     super_gc_heap_ptr_untyped.pos_ + 3));
  if (local_c9) {
    string::~string(&local_c8);
  }
  anon_unknown_46::json_parse_value
            ((value *)&holder.super_gc_heap_ptr_untyped.pos_,(json_lexer *)local_88);
  anon_unknown_46::json_lexer::skip_whitespace((json_lexer *)local_88);
  bVar1 = anon_unknown_46::json_lexer::eof((json_lexer *)local_88);
  if (!bVar1) {
    anon_unknown_46::json_lexer::throw_unexpected((json_lexer *)local_88);
  }
  sVar4 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size
                    ((vector<mjs::value,_std::allocator<mjs::value>_> *)lex.tok_.pos_);
  if (1 < sVar4) {
    pvVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[]
                       ((vector<mjs::value,_std::allocator<mjs::value>_> *)lex.tok_.pos_,1);
    vVar2 = value::type(pvVar3);
    if (vVar2 == object) {
      pvVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[]
                         ((vector<mjs::value,_std::allocator<mjs::value>_> *)lex.tok_.pos_,1);
      this = &value::object_value(pvVar3)->super_gc_heap_ptr_untyped;
      bVar1 = gc_heap_ptr_untyped::has_type<mjs::function_object>(this);
      if (bVar1) {
        gc_heap_ptr<mjs::global_object>::operator->(global);
        global_object::make_object((global_object *)local_118);
        poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_118);
        pgVar6 = gc_heap_ptr<mjs::global_object>::operator->(global);
        (*(pgVar6->super_object)._vptr_object[0x13])(&local_128,pgVar6,"");
        (*poVar5->_vptr_object[1])(poVar5,&local_128,&holder.super_gc_heap_ptr_untyped.pos_,0);
        string::~string(&local_128);
        pvVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[]
                           ((vector<mjs::value,_std::allocator<mjs::value>_> *)lex.tok_.pos_,1);
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                  (&local_138,L"");
        name._M_str = (wchar_t *)global;
        name._M_len = in_stack_fffffffffffffe38;
        anon_unknown_46::json_walk
                  (__return_storage_ptr__,(anon_unknown_46 *)global,
                   (gc_heap_ptr<mjs::global_object> *)pvVar3,(value *)local_118,
                   (object_ptr *)local_138._M_len,name);
        gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_118);
        goto LAB_0017f0eb;
      }
    }
  }
  value::value(__return_storage_ptr__,(value *)&holder.super_gc_heap_ptr_untyped.pos_);
LAB_0017f0eb:
  value::~value((value *)&holder.super_gc_heap_ptr_untyped.pos_);
  anon_unknown_46::json_lexer::~json_lexer((json_lexer *)local_88);
  return __return_storage_ptr__;
}

Assistant:

value json_parse(const gc_heap_ptr<global_object>& global, const std::vector<value>& args) {
    json_lexer lex{global, std::wstring{args.empty() ? L"undefined" : to_string(global.heap(), args.front()).view()}};
    value val = json_parse_value(lex);
    lex.skip_whitespace();
    if (!lex.eof()) {
        lex.throw_unexpected();
    }
    if (args.size() > 1 && args[1].type() == value_type::object && args[1].object_value().has_type<function_object>()) {
        auto holder = global->make_object();
        holder->put(global->common_string(""), val);
        return json_walk(global, args[1], holder, L"");
    }
    return val;
}